

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSOSerializer.cpp
# Opt level: O2

bool Diligent::ShaderSerializer<(Diligent::SerializerMode)0>::SerializeBytecodeOrSource
               (Serializer<(Diligent::SerializerMode)0> *Ser,ConstQual<ShaderCreateInfo> *CI)

{
  bool bVar1;
  Uint8 UseBytecode;
  void *pSource;
  
  UseBytecode = '\0';
  Serializer<(Diligent::SerializerMode)0>::Serialize<unsigned_char>(Ser,&UseBytecode);
  if (UseBytecode == '\0') {
    pSource = (void *)0x0;
    bVar1 = Serializer<(Diligent::SerializerMode)0>::SerializeBytes
                      (Ser,&pSource,&(CI->field_4).SourceLength,8);
    if (bVar1) {
      CI->Source = (Char *)pSource;
    }
  }
  else {
    bVar1 = Serializer<(Diligent::SerializerMode)0>::SerializeBytes
                      (Ser,&CI->ByteCode,&(CI->field_4).SourceLength,8);
  }
  return bVar1;
}

Assistant:

bool ShaderSerializer<SerializerMode::Read>::SerializeBytecodeOrSource(Serializer<SerializerMode::Read>& Ser,
                                                                       ConstQual<ShaderCreateInfo>&      CI)
{
    Uint8 UseBytecode = 0;
    Ser(UseBytecode);
    if (UseBytecode)
    {
        return Ser.SerializeBytes(CI.ByteCode, CI.ByteCodeSize);
    }
    else
    {
        const void* pSource = nullptr;
        if (!Ser.SerializeBytes(pSource, CI.SourceLength))
            return false;

        CI.Source = reinterpret_cast<const char*>(pSource);
        return true;
    }
}